

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

_Bool nhdp_domain_set_incoming_metric(nhdp_domain_metric *metric,nhdp_link *lnk,uint32_t metric_in)

{
  list_entity *plVar1;
  nhdp_link_domaindata *pnVar2;
  uint64_t uVar3;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  _Bool changed;
  list_entity *plStack_48;
  uint32_t new_metric;
  nhdp_domain *domain;
  nhdp_link_domaindata *linkdata;
  nhdp_domain_metric_postprocessor *processor;
  uint32_t metric_in_local;
  nhdp_link *lnk_local;
  nhdp_domain_metric *metric_local;
  
  __tempptr._3_1_ = false;
  plStack_48 = _domain_list.next + -0x2a;
  while( true ) {
    if (plStack_48[0x2a].prev == _domain_list.prev) break;
    if ((nhdp_domain_metric *)plStack_48[2].next == metric) {
      pnVar2 = lnk->_domaindata + *(int *)((long)&plStack_48[3].next + 4);
      __tempptr._4_4_ = metric_in;
      plVar1 = _domain_metric_postprocessor_list.next;
      while( true ) {
        linkdata = (nhdp_link_domaindata *)&plVar1[-1].prev;
        if (plVar1->prev == _domain_metric_postprocessor_list.prev) break;
        __tempptr._4_4_ = (*(code *)linkdata->metric)(plStack_48,lnk,__tempptr._4_4_);
        plVar1 = plVar1->next;
      }
      if ((pnVar2->metric).in != __tempptr._4_4_) {
        __tempptr._3_1_ = true;
        uVar3 = oonf_clock_getNow();
        pnVar2->last_metric_change = uVar3;
      }
      (pnVar2->metric).in = __tempptr._4_4_;
    }
    plStack_48 = plStack_48[0x2a].next + -0x2a;
  }
  return __tempptr._3_1_;
}

Assistant:

bool
nhdp_domain_set_incoming_metric(struct nhdp_domain_metric *metric, struct nhdp_link *lnk, uint32_t metric_in) {
  struct nhdp_domain_metric_postprocessor *processor;
  struct nhdp_link_domaindata *linkdata;
  struct nhdp_domain *domain;
  uint32_t new_metric;
  bool changed;

  changed = false;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->metric == metric) {
      linkdata = nhdp_domain_get_linkdata(domain, lnk);
      new_metric = metric_in;

      list_for_each_element(&_domain_metric_postprocessor_list, processor, _node) {
        new_metric = processor->process_in_metric(domain, lnk, new_metric);
      }

      if (linkdata->metric.in != new_metric) {
        changed = true;
        linkdata->last_metric_change = oonf_clock_getNow();
      }
      linkdata->metric.in = new_metric;
    }
  }
  return changed;
}